

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O0

bool type_safe::detail::
     compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>
     ::compare_equal(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                     *a,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                        *b)

{
  bool bVar1;
  equal_visitor local_21;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pbStack_20;
  equal_visitor v;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *b_local;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *a_local;
  
  pbStack_20 = b;
  bVar1 = basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::has_value
                    (a);
  if (bVar1) {
    equal_visitor::equal_visitor(&local_21);
    with<type_safe::optional_variant_policy,int,double,debugger_type,type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>::equal_visitor&,type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
              (a,&local_21,pbStack_20);
  }
  else {
    bVar1 = basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::has_value
                      (pbStack_20);
    local_21.result = (bool)(bVar1 ^ 0xff);
  }
  a_local._7_1_ = (bool)(local_21.result & 1);
  return a_local._7_1_;
}

Assistant:

static bool compare_equal(const Variant& a, const Variant& b)
        {
            if (!a.has_value())
                // to be equal, b must not have value as well
                return !b.has_value();

            equal_visitor v;
            with(a, v, b);
            return v.result;
        }